

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O0

void __thiscall helics::FilterFederate::~FilterFederate(FilterFederate *this)

{
  TimeCoordinator *in_RDI;
  deque<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
  *in_stack_00000040;
  nullptr_t pvVar1;
  
  *(undefined8 *)
   &in_RDI[1].super_BaseTimeCoordinator.sendMessageFunction.super__Function_base._M_functor = 0;
  in_RDI[1].super_BaseTimeCoordinator.sendMessageFunction.super__Function_base._M_functor.
  _M_pod_data[8] = '\0';
  std::
  map<helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>_>
  ::clear((map<helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>_>
           *)0x63f481);
  pvVar1 = (nullptr_t)0x0;
  std::function<void_(const_helics::ActionMessage_&)>::operator=
            ((function<void_(const_helics::ActionMessage_&)> *)in_RDI,(nullptr_t)0x0);
  std::function<void_(helics::ActionMessage_&&)>::operator=
            ((function<void_(helics::ActionMessage_&&)> *)in_RDI,pvVar1);
  std::function<void_(const_helics::ActionMessage_&)>::operator=
            ((function<void_(const_helics::ActionMessage_&)> *)in_RDI,pvVar1);
  std::function<void_(helics::ActionMessage_&&)>::operator=
            ((function<void_(helics::ActionMessage_&&)> *)in_RDI,pvVar1);
  std::function<void_(helics::ActionMessage_&)>::operator=
            ((function<void_(helics::ActionMessage_&)> *)in_RDI,pvVar1);
  std::
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator=((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)in_RDI,pvVar1);
  std::function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>::
  operator=((function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>
             *)in_RDI,pvVar1);
  std::
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::clear((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
           *)0x63f529);
  std::
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::clear((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
           *)0x63f53a);
  gmlc::containers::MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle>::clear
            ((MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle> *)in_RDI);
  gmlc::containers::MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle>::
  ~MappedPointerVector((MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle> *)in_RDI);
  std::
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~map((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          *)0x63f56f);
  std::
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~map((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          *)0x63f580);
  std::
  deque<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
  ::~deque(in_stack_00000040);
  std::function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>::
  ~function((function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>
             *)0x63f5a2);
  std::
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x63f5b3);
  std::function<void_(helics::ActionMessage_&)>::~function
            ((function<void_(helics::ActionMessage_&)> *)0x63f5c4);
  std::function<void_(helics::ActionMessage_&&)>::~function
            ((function<void_(helics::ActionMessage_&&)> *)0x63f5d5);
  CLI::std::function<void_(const_helics::ActionMessage_&)>::~function
            ((function<void_(const_helics::ActionMessage_&)> *)0x63f5e6);
  std::function<void_(helics::ActionMessage_&&)>::~function
            ((function<void_(helics::ActionMessage_&&)> *)0x63f5f7);
  CLI::std::function<void_(const_helics::ActionMessage_&)>::~function
            ((function<void_(const_helics::ActionMessage_&)> *)0x63f608);
  std::
  map<helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>_>
  ::~map((map<helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>_>
          *)0x63f619);
  TimeCoordinator::~TimeCoordinator(in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  return;
}

Assistant:

FilterFederate::~FilterFederate()
{
    mHandles = nullptr;
    current_state = FederateStates::CREATED;
    /// map of all local filters
    filterCoord.clear();
    // The interface_handle used is here is usually referencing an endpoint

    mQueueMessage = nullptr;
    mQueueMessageMove = nullptr;
    mSendMessage = nullptr;
    mSendMessageMove = nullptr;

    mDeliverMessage = nullptr;

    mLogger = nullptr;
    mGetAirLock = nullptr;

    /// sets of ongoing filtered messages
    ongoingFilterProcesses.clear();
    /// sets of ongoing destination filter processing
    ongoingDestFilterProcesses.clear();

    filters.clear();
}